

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_map.cpp
# Opt level: O2

void AM_drawSubsectors(void)

{
  double *pdVar1;
  double dVar2;
  undefined4 *puVar3;
  F3DFloor *pFVar4;
  secplane_t *psVar5;
  sector_t *psVar6;
  TVector2<float> TVar7;
  DVector3 *pDVar8;
  double dVar9;
  DFrameBuffer *pDVar10;
  int iVar11;
  subsector_t *psVar12;
  undefined4 extraout_var;
  AActor *pAVar13;
  lightlist_t *plVar14;
  FDynamicColormap *pFVar15;
  FTexture *pFVar16;
  DVector3 *pDVar17;
  ulong uVar18;
  secplane_t *plane;
  long lVar19;
  FDynamicColormap **ppFVar20;
  int i;
  long lVar21;
  bool bVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  double dVar27;
  double dVar28;
  FTextureID local_2d8;
  int floorlight;
  double local_2d0;
  undefined1 local_2c8 [16];
  mpoint_t originpt;
  undefined4 local_298;
  undefined4 uStack_294;
  undefined4 uStack_290;
  undefined4 uStack_28c;
  double local_288;
  double local_280;
  double local_278;
  undefined8 local_270;
  DAngle local_268;
  int ceilinglight;
  double local_258;
  double dStack_250;
  sector_t_conflict tempsec;
  sector_t_conflict *sector;
  
  if ((AM_drawSubsectors()::points == '\0') &&
     (iVar11 = __cxa_guard_acquire(&AM_drawSubsectors()::points), iVar11 != 0)) {
    AM_drawSubsectors::points = (TArray<TVector2<float>,_TVector2<float>_>)ZEXT816(0);
    __cxa_atexit(TArray<TVector2<float>,_TVector2<float>_>::~TArray,&AM_drawSubsectors::points,
                 &__dso_handle);
    __cxa_guard_release(&AM_drawSubsectors()::points);
  }
  dVar9 = scale_mtof;
  (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x10])();
  lVar21 = 0;
  do {
    if (numsubsectors <= lVar21) {
      (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x11])();
      return;
    }
    if ((((subsectors[lVar21].flags & 4U) == 0) &&
        ((((subsectors[lVar21].flags & 2U) != 0 &&
          (((subsectors[lVar21].render_sector)->MoreFlags & 0x100) == 0)) || (am_cheat.Value != 0)))
        ) && (((am_portaloverlay.Value != true ||
               (iVar11 = (subsectors[lVar21].render_sector)->PortalGroup, iVar11 == 0)) ||
              (iVar11 == MapPortalGroup)))) {
      TArray<TVector2<float>,_TVector2<float>_>::Resize
                (&AM_drawSubsectors::points,subsectors[lVar21].numlines);
      lVar19 = 0;
      psVar12 = subsectors;
      for (uVar18 = 0; uVar18 < psVar12[lVar21].numlines; uVar18 = uVar18 + 1) {
        puVar3 = *(undefined4 **)((long)&(psVar12[lVar21].firstline)->v1 + lVar19);
        local_298 = *puVar3;
        uStack_294 = puVar3[1];
        uStack_290 = puVar3[2];
        uStack_28c = puVar3[3];
        if ((am_rotate.Value == 1) || ((am_rotate.Value == 2 && (viewactive == true)))) {
          AM_rotatePoint((double *)&local_298,(double *)&uStack_290);
          psVar12 = subsectors;
        }
        TVar7.Y = (float)((double)f_y +
                         ((double)f_h - ((double)CONCAT44(uStack_28c,uStack_290) - m_y) * dVar9));
        TVar7.X = (float)((double)f_x + ((double)CONCAT44(uStack_294,local_298) - m_x) * dVar9);
        AM_drawSubsectors::points.Array[uVar18] = TVar7;
        lVar19 = lVar19 + 0x30;
      }
      iVar11 = (*Renderer->_vptr_FRenderer[0x14])
                         (Renderer,psVar12[lVar21].render_sector,&tempsec,&floorlight,&ceilinglight,
                          0);
      sector = (sector_t_conflict *)CONCAT44(extraout_var,iVar11);
      uVar25 = DAT_005a5040._8_4_;
      uVar26 = DAT_005a5040._12_4_;
      originpt.x = (double)((ulong)sector->planes[0].xform.xOffs ^ (ulong)DAT_005a5040);
      originpt.y = sector->planes[0].xform.yOffs + sector->planes[0].xform.baseyOffs;
      uVar18 = (ulong)(sector->planes[0].xform.baseAngle.Degrees +
                      sector->planes[0].xform.Angle.Degrees) ^ (ulong)DAT_005a5040;
      uVar23 = (undefined4)uVar18;
      uVar24 = (undefined4)(uVar18 >> 0x20);
      local_2d8.texnum = sector->planes[0].Texture.texnum;
      local_258 = sector->planes[0].xform.xScale;
      dStack_250 = sector->planes[0].xform.yScale;
      if ((sector->e->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count == 0) {
        ppFVar20 = &sector->ColorMap;
      }
      else {
        local_2c8._8_4_ = uVar25;
        local_2c8._0_8_ = uVar18;
        local_2c8._12_4_ = uVar26;
        local_2d0 = ViewPos.Z;
        pAVar13 = GC::ReadBarrier<AActor>((AActor **)(&DAT_017dc0f8 + (long)consoleplayer * 0x54));
        if ((pAVar13 == (AActor *)0x0) ||
           (pAVar13 = GC::ReadBarrier<AActor>
                                ((AActor **)(&DAT_017dc0f8 + (long)consoleplayer * 0x54)),
           sector != (sector_t_conflict *)pAVar13->Sector)) {
          pDVar17 = (DVector3 *)&sector->centerspot;
          pDVar8 = (DVector3 *)&sector->centerspot;
        }
        else {
          pDVar17 = &ViewPos;
          pDVar8 = &ViewPos;
        }
        dVar27 = pDVar17->X;
        dVar2 = pDVar8->Y;
        plane = &sector->floorplane;
        for (uVar18 = 0;
            (sector->e->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count != uVar18;
            uVar18 = uVar18 + 1) {
          pFVar4 = (sector->e->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array[uVar18];
          if (((pFVar4->flags & 0x1009) == 9) && (pFVar4->alpha != 0)) {
            psVar5 = (pFVar4->top).plane;
            dVar28 = ((psVar5->normal).Y * dVar2 + psVar5->D + (psVar5->normal).X * dVar27) *
                     psVar5->negiC;
            if (dVar28 <= (dVar2 * (sector->ceilingplane).normal.Y +
                          (sector->ceilingplane).normal.X * dVar27 + (sector->ceilingplane).D) *
                          (sector->ceilingplane).negiC) {
              if (dVar28 < ((sector->floorplane).normal.Y * dVar2 +
                           (sector->floorplane).normal.X * dVar27 + (sector->floorplane).D) *
                           (sector->floorplane).negiC) break;
              if (dVar28 < local_2d0) {
                psVar6 = (pFVar4->top).model;
                local_2d8.texnum = ((pFVar4->top).texture)->texnum;
                bVar22 = (pFVar4->flags >> 0xd & 1) == 0;
                local_2c8._8_8_ = 0x8000000000000000;
                local_2c8._0_8_ =
                     -(psVar6->planes[bVar22].xform.baseAngle.Degrees +
                      psVar6->planes[bVar22].xform.Angle.Degrees);
                pdVar1 = &psVar6->planes[bVar22].xform.xScale;
                local_258 = *pdVar1;
                dStack_250 = pdVar1[1];
                originpt.x = -psVar6->planes[bVar22].xform.xOffs;
                originpt.y = psVar6->planes[bVar22].xform.yOffs +
                             psVar6->planes[bVar22].xform.baseyOffs;
                plane = psVar5;
                break;
              }
            }
          }
        }
        plVar14 = P_GetPlaneLight(sector,plane,false);
        floorlight = (int)*plVar14->p_lightlevel;
        ppFVar20 = &plVar14->extra_colormap;
        uVar23 = local_2c8._0_4_;
        uVar24 = local_2c8._4_4_;
        uVar25 = local_2c8._8_4_;
        uVar26 = local_2c8._12_4_;
      }
      if (local_2d8.texnum != skyflatnum.texnum) {
        pFVar15 = *ppFVar20;
        local_2c8._4_4_ = uVar24;
        local_2c8._0_4_ = uVar23;
        local_2c8._8_4_ = uVar25;
        local_2c8._12_4_ = uVar26;
        if (((double)CONCAT44(uVar24,uVar23) != 0.0) || (NAN((double)CONCAT44(uVar24,uVar23)))) {
          local_268.Degrees = (double)CONCAT44(uVar24,uVar23);
          AM_rotate(&originpt.x,&originpt.y,&local_268);
          uVar23 = local_2c8._0_4_;
          uVar24 = local_2c8._4_4_;
          uVar25 = local_2c8._8_4_;
          uVar26 = local_2c8._12_4_;
        }
        if ((am_rotate.Value == 1) || ((am_rotate.Value == 2 && (viewactive == true)))) {
          local_2c8._8_4_ = uVar25;
          local_2c8._0_8_ = (double)CONCAT44(uVar24,uVar23) + 90.0;
          local_2c8._12_4_ = uVar26;
          pAVar13 = GC::ReadBarrier<AActor>((AActor **)(&DAT_017dc0f8 + (long)consoleplayer * 0x54))
          ;
          uVar23 = local_2c8._12_4_;
          local_2c8._8_4_ = local_2c8._8_4_;
          local_2c8._0_8_ = local_2c8._0_8_ - (pAVar13->Angles).Yaw.Degrees;
          local_2c8._12_4_ = uVar23;
          AM_rotatePoint(&originpt.x,&originpt.y);
        }
        local_288 = (double)f_x;
        local_2d0 = originpt.x - m_x;
        local_280 = (double)f_y;
        dVar27 = (double)f_h;
        local_278 = originpt.y - m_y;
        if ((subsectors[lVar21].flags & 2) == 0) {
          pFVar15 = GetSpecialLights((PalEntry)
                                     ((pFVar15->Color).field_0.field_0.b + 0xa0 >> 1 |
                                     (uint)(pFVar15->Color).field_0.field_0.g * 0x80 + 0x6400 &
                                     0xff00 | (uint)(pFVar15->Color).field_0.field_0.r * 0x8000 +
                                              0x7f8000 & 0xff0000),
                                     (PalEntry)(pFVar15->Fade).field_0.field_0,
                                     (0xff - pFVar15->Desaturate) / -4 + 0xff);
          floorlight = (floorlight + 3000) / 0x10;
        }
        pFVar16 = FTextureManager::operator()(&TexMan,local_2d8,false);
        pDVar10 = screen;
        if ((pFVar16 != (FTexture *)0x0) && (pFVar16->UseType != '\r')) {
          local_2d0 = local_2d0 * dVar9 + local_288;
          dVar27 = (dVar27 - local_278 * dVar9) + local_280;
          pFVar16 = FTextureManager::operator()(&TexMan,local_2d8,false);
          local_270 = local_2c8._0_8_;
          (*(pDVar10->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x12])
                    (SUB84(local_2d0,0),SUB84(dVar27,0),dVar9 / local_258,dVar9 / dStack_250,pDVar10
                     ,pFVar16,AM_drawSubsectors::points.Array,(ulong)AM_drawSubsectors::points.Count
                     ,&local_270,pFVar15,(ulong)(uint)floorlight,(ulong)(uint)(f_h + f_y));
        }
      }
    }
    lVar21 = lVar21 + 1;
  } while( true );
}

Assistant:

void AM_drawSubsectors()
{
	static TArray<FVector2> points;
	double scale = scale_mtof;
	DAngle rotation;
	sector_t tempsec;
	int floorlight, ceilinglight;
	double scalex, scaley;
	double originx, originy;
	FDynamicColormap *colormap;
	mpoint_t originpt;

	screen->StartSimplePolys();
	for (int i = 0; i < numsubsectors; ++i)
	{
		if (subsectors[i].flags & SSECF_POLYORG)
		{
			continue;
		}

		if ((!(subsectors[i].flags & SSECF_DRAWN) || (subsectors[i].render_sector->MoreFlags & SECF_HIDDEN)) && am_cheat == 0)
		{
			continue;
		}

		if (am_portaloverlay && subsectors[i].render_sector->PortalGroup != MapPortalGroup && subsectors[i].render_sector->PortalGroup != 0)
		{
			continue;
		}

		// Fill the points array from the subsector.
		points.Resize(subsectors[i].numlines);
		for (DWORD j = 0; j < subsectors[i].numlines; ++j)
		{
			mpoint_t pt = { subsectors[i].firstline[j].v1->fX(),
							subsectors[i].firstline[j].v1->fY() };
			if (am_rotate == 1 || (am_rotate == 2 && viewactive))
			{
				AM_rotatePoint(&pt.x, &pt.y);
			}
			points[j].X = float(f_x + ((pt.x - m_x) * scale));
			points[j].Y = float(f_y + (f_h - (pt.y - m_y) * scale));
		}
		// For lighting and texture determination
		sector_t *sec = Renderer->FakeFlat(subsectors[i].render_sector, &tempsec, &floorlight, &ceilinglight, false);
		// Find texture origin.
		originpt.x = -sec->GetXOffset(sector_t::floor);
		originpt.y = sec->GetYOffset(sector_t::floor);
		rotation = -sec->GetAngle(sector_t::floor);
		// Coloring for the polygon
		colormap = sec->ColorMap;

		FTextureID maptex = sec->GetTexture(sector_t::floor);

		scalex = sec->GetXScale(sector_t::floor);
		scaley = sec->GetYScale(sector_t::floor);

		if (sec->e->XFloor.ffloors.Size())
		{
			secplane_t *floorplane = &sec->floorplane;

			// Look for the highest floor below the camera viewpoint.
			// Check the center of the subsector's sector. Do not check each
			// subsector separately because that might result in different planes for
			// different subsectors of the same sector which is not wanted here.
			// (Make the comparison in floating point to avoid overflows and improve performance.)
			double secx;
			double secy;
			double seczb, seczt;
			double cmpz = ViewPos.Z;

			if (players[consoleplayer].camera && sec == players[consoleplayer].camera->Sector)
			{
				// For the actual camera sector use the current viewpoint as reference.
				secx = ViewPos.X;
				secy = ViewPos.Y;
			}
			else
			{
				secx = sec->centerspot.X;
				secy = sec->centerspot.Y;
			}
			seczb = floorplane->ZatPoint(secx, secy);
			seczt = sec->ceilingplane.ZatPoint(secx, secy);

			for (unsigned int i = 0; i < sec->e->XFloor.ffloors.Size(); ++i)
			{
				F3DFloor *rover = sec->e->XFloor.ffloors[i];
				if (!(rover->flags & FF_EXISTS)) continue;
				if (rover->flags & FF_FOG) continue;
				if (!(rover->flags & FF_RENDERPLANES)) continue;
				if (rover->alpha == 0) continue;
				double roverz = rover->top.plane->ZatPoint(secx, secy);
				// Ignore 3D floors that are above or below the sector itself:
				// they are hidden. Since 3D floors are sorted top to bottom,
				// if we get below the sector floor, we can stop.
				if (roverz > seczt) continue;
				if (roverz < seczb) break;
				if (roverz < cmpz)
				{
					maptex = *(rover->top.texture);
					floorplane = rover->top.plane;
					sector_t *model = rover->top.model;
					int selector = (rover->flags & FF_INVERTPLANES) ? sector_t::floor : sector_t::ceiling;
					rotation = -model->GetAngle(selector);
					scalex = model->GetXScale(selector);
					scaley = model->GetYScale(selector);
					originpt.x = -model->GetXOffset(selector);
					originpt.y = model->GetYOffset(selector);
					break;
				}
			}

			lightlist_t *light = P_GetPlaneLight(sec, floorplane, false);
			floorlight = *light->p_lightlevel;
			colormap = light->extra_colormap;
		}
		if (maptex == skyflatnum)
		{
			continue;
		}

		// Apply the floor's rotation to the texture origin.
		if (rotation != 0)
		{
			AM_rotate(&originpt.x, &originpt.y, rotation);
		}
		// Apply the automap's rotation to the texture origin.
		if (am_rotate == 1 || (am_rotate == 2 && viewactive))
		{
			rotation = rotation + 90. - players[consoleplayer].camera->Angles.Yaw;
			AM_rotatePoint(&originpt.x, &originpt.y);
		}
		originx = f_x + ((originpt.x - m_x) * scale);
		originy = f_y + (f_h - (originpt.y - m_y) * scale);

		// If this subsector has not actually been seen yet (because you are cheating
		// to see it on the map), tint and desaturate it.
		if (!(subsectors[i].flags & SSECF_DRAWN))
		{
			colormap = GetSpecialLights(
				MAKERGB(
					(colormap->Color.r + 255) / 2,
					(colormap->Color.g + 200) / 2,
					(colormap->Color.b + 160) / 2),
				colormap->Fade,
				255 - (255 - colormap->Desaturate) / 4);
			floorlight = (floorlight + 200 * 15) / 16;
		}

		// Draw the polygon.
		FTexture *pic = TexMan(maptex);
		if (pic != NULL && pic->UseType != FTexture::TEX_Null)
		{
			screen->FillSimplePoly(TexMan(maptex),
				&points[0], points.Size(),
				originx, originy,
				scale / scalex,
				scale / scaley,
				rotation,
				colormap,
				floorlight,
				f_y + f_h
				);
		}
	}
	screen->FinishSimplePolys();
}